

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_info.cpp
# Opt level: O3

string * __thiscall
duckdb::CreateTableInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateTableInfo *this)

{
  pointer pcVar1;
  pointer pSVar2;
  long *plVar3;
  undefined8 *puVar4;
  string *name;
  size_type *psVar5;
  ColumnList *extraout_RDX;
  ColumnList *extraout_RDX_00;
  ColumnList *extraout_RDX_01;
  ColumnList *columns;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string local_68;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_4ed193b + 9);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_CreateInfo).on_conflict == REPLACE_ON_CONFLICT) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->super_CreateInfo).temporary == true) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_CreateInfo).on_conflict == IGNORE_ON_CONFLICT) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->super_CreateInfo).temporary == true) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,anon_var_dwarf_4ed193b + 9);
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar1 = (this->super_CreateInfo).catalog._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->super_CreateInfo).catalog._M_string_length
              );
  }
  name = &this->table;
  ParseInfo::QualifierToString(&local_68,&local_48,&(this->super_CreateInfo).schema,name);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p)
  ;
  paVar6 = &local_68.field_2;
  columns = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar6) {
    operator_delete(local_68._M_dataplus._M_p);
    columns = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
    columns = extraout_RDX_01;
  }
  if ((this->query).
      super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
      .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl ==
      (SelectStatement *)0x0) {
    TableCatalogEntry::ColumnsToSQL_abi_cxx11_
              (&local_48,(TableCatalogEntry *)&this->columns,(ColumnList *)&this->constraints,
               (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                *)name);
    puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_48);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68.field_2._8_8_ = puVar4[3];
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_68._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
  }
  else {
    TableCatalogEntry::ColumnNamesToSQL_abi_cxx11_
              (&local_68,(TableCatalogEntry *)&this->columns,columns);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar6) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    pSVar2 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->query);
    (*(pSVar2->super_SQLStatement)._vptr_SQLStatement[2])(&local_48);
    plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1daddc9);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68.field_2._8_8_ = plVar3[3];
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar5;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar3;
    }
    local_68._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_68._M_dataplus._M_p = (pointer)paVar6;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)paVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CreateTableInfo::ToString() const {
	string ret = "";

	ret += "CREATE";
	if (on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
		ret += " OR REPLACE";
	}
	if (temporary) {
		ret += " TEMP";
	}
	ret += " TABLE ";

	if (on_conflict == OnCreateConflict::IGNORE_ON_CONFLICT) {
		ret += " IF NOT EXISTS ";
	}
	ret += QualifierToString(temporary ? "" : catalog, schema, table);

	if (query != nullptr) {
		ret += TableCatalogEntry::ColumnNamesToSQL(columns);
		ret += " AS " + query->ToString();
	} else {
		ret += TableCatalogEntry::ColumnsToSQL(columns, constraints) + ";";
	}
	return ret;
}